

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O0

int SMPI_Gatherv(void *sendbuf,int sendcount,SMPI_Datatype sendtype,void *recvbuf,size_t *recvcounts
                ,size_t *displs,SMPI_Datatype recvtype,int root,SMPI_Comm comm)

{
  undefined4 in_EDX;
  int ret;
  SMPI_Datatype in_stack_000001bc;
  size_t *in_stack_000001c0;
  size_t *in_stack_000001c8;
  void *in_stack_000001d0;
  int in_stack_000001dc;
  unsigned_long *in_stack_000001e0;
  int in_stack_000001f0;
  SMPI_Comm in_stack_000001f8;
  int local_2c;
  
  local_2c = 0;
  switch(in_EDX) {
  case 0:
    local_2c = anon_unknown.dwarf_17824::SMPI_Gatherv_Impl<int>
                         ((int *)in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,
                          in_stack_000001c8,in_stack_000001c0,in_stack_000001bc,in_stack_000001f0,
                          in_stack_000001f8);
    break;
  case 1:
    local_2c = anon_unknown.dwarf_17824::SMPI_Gatherv_Impl<long>
                         ((long *)in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,
                          in_stack_000001c8,in_stack_000001c0,in_stack_000001bc,in_stack_000001f0,
                          in_stack_000001f8);
    break;
  case 2:
    local_2c = anon_unknown.dwarf_17824::SMPI_Gatherv_Impl<unsigned_long>
                         (in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,in_stack_000001c8,
                          in_stack_000001c0,in_stack_000001bc,in_stack_000001f0,in_stack_000001f8);
    break;
  case 3:
    local_2c = anon_unknown.dwarf_17824::SMPI_Gatherv_Impl<char>
                         ((char *)in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,
                          in_stack_000001c8,in_stack_000001c0,in_stack_000001bc,in_stack_000001f0,
                          in_stack_000001f8);
    break;
  case 4:
    local_2c = anon_unknown.dwarf_17824::SMPI_Gatherv_Impl<unsigned_char>
                         ((uchar *)in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,
                          in_stack_000001c8,in_stack_000001c0,in_stack_000001bc,in_stack_000001f0,
                          in_stack_000001f8);
  }
  return local_2c;
}

Assistant:

int SMPI_Gatherv(const void *sendbuf, int sendcount, SMPI_Datatype sendtype, void *recvbuf,
                 const size_t *recvcounts, const size_t *displs, SMPI_Datatype recvtype, int root,
                 SMPI_Comm comm)
{
    int ret = 0;
    switch (sendtype)
    {
#define F(type)                                                                                    \
    ret = SMPI_Gatherv_Impl(static_cast<const type *>(sendbuf), sendcount, recvbuf, recvcounts,    \
                            displs, recvtype, root, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return ret;
}